

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nl-solver.cc
# Opt level: O0

void __thiscall
mp::NLFeeder_Easy::FeedRowAndObjNames<mp::StringFileWriter>
          (NLFeeder_Easy *this,StringFileWriter *wrt)

{
  bool bVar1;
  int iVar2;
  NLModel *pNVar3;
  char **ppcVar4;
  StringFileWriter *in_RSI;
  NLFeeder_Easy *in_RDI;
  int i;
  char *in_stack_ffffffffffffffc8;
  StringFileWriter *in_stack_ffffffffffffffd0;
  int local_14;
  
  pNVar3 = NLME(in_RDI);
  ppcVar4 = NLModel::RowNames(pNVar3);
  if ((ppcVar4 != (char **)0x0) &&
     (bVar1 = StringFileWriter::operator_cast_to_bool(in_stack_ffffffffffffffd0), bVar1)) {
    local_14 = 0;
    while( true ) {
      pNVar3 = NLME(in_RDI);
      iVar2 = NLModel::NumRows(pNVar3);
      if (iVar2 <= local_14) break;
      in_stack_ffffffffffffffd0 = in_RSI;
      pNVar3 = NLME(in_RDI);
      NLModel::RowNames(pNVar3);
      operator<<(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      local_14 = local_14 + 1;
    }
    pNVar3 = NLME(in_RDI);
    NLModel::ObjName(pNVar3);
    operator<<(in_stack_ffffffffffffffd0,(char *)in_RSI);
  }
  return;
}

Assistant:

void FeedRowAndObjNames(RowObjNameWriter& wrt) {
    if (NLME().RowNames() && wrt) {
      for (int i=0; i<NLME().NumRows(); ++i)
        wrt << NLME().RowNames()[i];
      wrt << NLME().ObjName();
    }
  }